

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers_unittest.cc
# Opt level: O2

void __thiscall
Test_TemplateModifiers_ValidateImgSrcUrlHtmlEscape::
Test_TemplateModifiers_ValidateImgSrcUrlHtmlEscape
          (Test_TemplateModifiers_ValidateImgSrcUrlHtmlEscape *this)

{
  _func_void *local_8;
  
  local_8 = Run;
  std::vector<void(*)(),std::allocator<void(*)()>>::emplace_back<void(*)()>
            ((vector<void(*)(),std::allocator<void(*)()>> *)&g_testlist,&local_8);
  return;
}

Assistant:

TEST(TemplateModifiers, ValidateImgSrcUrlHtmlEscape) {
  GOOGLE_NAMESPACE::TemplateDictionary dict("TestValidateImgSrcUrlHtmlEscape", NULL);
  dict.SetEscapedValue("easy http URL", "http://www.google.com",
                       GOOGLE_NAMESPACE::validate_img_src_url_and_html_escape);
  dict.SetEscapedValue("harder https URL",
                       "https://www.google.com/search?q=f&hl=en",
                       GOOGLE_NAMESPACE::validate_img_src_url_and_html_escape);
  dict.SetEscapedValue("easy javascript URL",
                       "javascript:alert(document.cookie)",
                       GOOGLE_NAMESPACE::validate_img_src_url_and_html_escape);
  dict.SetEscapedValue("harder javascript URL",
                       "javascript:alert(10/5)",
                       GOOGLE_NAMESPACE::validate_img_src_url_and_html_escape);
  dict.SetEscapedValue("easy relative URL",
                       "foobar.html",
                       GOOGLE_NAMESPACE::validate_img_src_url_and_html_escape);
  dict.SetEscapedValue("harder relative URL",
                       "/search?q=green flowers&hl=en",
                       GOOGLE_NAMESPACE::validate_img_src_url_and_html_escape);
  dict.SetEscapedValue("ftp URL",
                       "ftp://ftp.example.org/pub/file.txt",
                       GOOGLE_NAMESPACE::validate_img_src_url_and_html_escape);

  GOOGLE_NAMESPACE::TemplateDictionaryPeer peer(&dict);  // peer can look inside dicts
  EXPECT_STREQ(peer.GetSectionValue("easy http URL"),
               "http://www.google.com");
  EXPECT_STREQ(peer.GetSectionValue("harder https URL"),
               "https://www.google.com/search?q=f&amp;hl=en");
  EXPECT_STREQ(peer.GetSectionValue("easy javascript URL"),
               GOOGLE_NAMESPACE::ValidateUrl::kUnsafeImgSrcUrlReplacement);
  EXPECT_STREQ(peer.GetSectionValue("harder javascript URL"),
               GOOGLE_NAMESPACE::ValidateUrl::kUnsafeImgSrcUrlReplacement);
  EXPECT_STREQ(peer.GetSectionValue("easy relative URL"),
               "foobar.html");
  EXPECT_STREQ(peer.GetSectionValue("harder relative URL"),
               "/search?q=green flowers&amp;hl=en");
  EXPECT_STREQ(peer.GetSectionValue("ftp URL"),
               "ftp://ftp.example.org/pub/file.txt");
}